

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O2

int32_t u_getFC_NFKC_Closure_63(UChar32 c,UChar *dest,int32_t destCapacity,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint16_t uVar2;
  uint textLength;
  int32_t iVar3;
  Normalizer2 *norm2;
  Normalizer2Impl *this;
  UnicodeString *src;
  UChar *folded1;
  UnicodeString folded1String;
  UnicodeString kc2;
  UnicodeString kc1;
  UnicodeString folded2String;
  Char16Ptr local_168;
  ConstChar16Ptr local_160;
  UChar *local_158;
  UChar *local_148;
  UChar *local_138;
  UnicodeString local_130;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if ((destCapacity < 0) || (destCapacity != 0 && dest == (UChar *)0x0)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  norm2 = icu_63::Normalizer2::getNFKCInstance(pErrorCode);
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  local_130.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
  local_130.fUnion.fStackFields.fLengthAndFlags = 2;
  textLength = ucase_toFullFolding_63(c,&local_138,0);
  if ((int)textLength < 0) {
    this = icu_63::Normalizer2Factory::getImpl(norm2);
    uVar2 = icu_63::Normalizer2Impl::getNorm16(this,c);
    if (((0xfe01 < uVar2) || (uVar2 < this->minNoNo)) || (this->minMaybeYes <= uVar2)) {
      iVar3 = u_terminateUChars_63(dest,destCapacity,0,pErrorCode);
      goto LAB_002b0f8c;
    }
    icu_63::UnicodeString::setTo(&local_130,c);
  }
  else if (textLength < 0x20) {
    local_160.p_ = local_138;
    icu_63::UnicodeString::setTo(&local_130,'\0',&local_160,textLength);
    local_148 = local_160.p_;
  }
  else {
    icu_63::UnicodeString::setTo(&local_130,textLength);
  }
  icu_63::Normalizer2::normalize(&local_b0,norm2,&local_130,pErrorCode);
  icu_63::UnicodeString::UnicodeString(&local_70,&local_b0);
  src = icu_63::UnicodeString::foldCase(&local_70,0);
  icu_63::Normalizer2::normalize(&local_f0,norm2,src,pErrorCode);
  if ((*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
     (UVar1 = icu_63::UnicodeString::operator==(&local_b0,&local_f0), UVar1 == '\0')) {
    local_168.p_ = dest;
    iVar3 = icu_63::UnicodeString::extract(&local_f0,&local_168,destCapacity,pErrorCode);
    local_158 = local_168.p_;
  }
  else {
    iVar3 = u_terminateUChars_63(dest,destCapacity,0,pErrorCode);
  }
  icu_63::UnicodeString::~UnicodeString(&local_f0);
  icu_63::UnicodeString::~UnicodeString(&local_70);
  icu_63::UnicodeString::~UnicodeString(&local_b0);
LAB_002b0f8c:
  icu_63::UnicodeString::~UnicodeString(&local_130);
  return iVar3;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_getFC_NFKC_Closure(UChar32 c, UChar *dest, int32_t destCapacity, UErrorCode *pErrorCode) {
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    // Compute the FC_NFKC_Closure on the fly:
    // We have the API for complete coverage of Unicode properties, although
    // this value by itself is not useful via API.
    // (What could be useful is a custom normalization table that combines
    // case folding and NFKC.)
    // For the derivation, see Unicode's DerivedNormalizationProps.txt.
    const Normalizer2 *nfkc=Normalizer2::getNFKCInstance(*pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    // first: b = NFKC(Fold(a))
    UnicodeString folded1String;
    const UChar *folded1;
    int32_t folded1Length=ucase_toFullFolding(c, &folded1, U_FOLD_CASE_DEFAULT);
    if(folded1Length<0) {
        const Normalizer2Impl *nfkcImpl=Normalizer2Factory::getImpl(nfkc);
        if(nfkcImpl->getCompQuickCheck(nfkcImpl->getNorm16(c))!=UNORM_NO) {
            return u_terminateUChars(dest, destCapacity, 0, pErrorCode);  // c does not change at all under CaseFolding+NFKC
        }
        folded1String.setTo(c);
    } else {
        if(folded1Length>UCASE_MAX_STRING_LENGTH) {
            folded1String.setTo(folded1Length);
        } else {
            folded1String.setTo(FALSE, folded1, folded1Length);
        }
    }
    UnicodeString kc1=nfkc->normalize(folded1String, *pErrorCode);
    // second: c = NFKC(Fold(b))
    UnicodeString folded2String(kc1);
    UnicodeString kc2=nfkc->normalize(folded2String.foldCase(), *pErrorCode);
    // if (c != b) add the mapping from a to c
    if(U_FAILURE(*pErrorCode) || kc1==kc2) {
        return u_terminateUChars(dest, destCapacity, 0, pErrorCode);
    } else {
        return kc2.extract(dest, destCapacity, *pErrorCode);
    }
}